

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ComputeInternalForces(ChElementHexaANCF_3813_9 *this)

{
  ChVectorDynamic<> *in_RSI;
  
  ComputeInternalForces((ChElementHexaANCF_3813_9 *)&this[-1].field_0x52f8,in_RSI);
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    CalcCoordMatrix(m_d);
    CalcCoordDerivMatrix(m_d_dt);
    m_ddT = m_d * m_d.transpose();

    Fi.setZero();
    // Set plastic counter to zero. This runs for each integration point
    m_InteCounter = 0;
    Brick9_Force formula(this);
    ChVectorN<double, 33> result;
    result.setZero();
    ChQuadrature::Integrate3D<ChVectorN<double, 33>>(result,   // result of integration
                                                     formula,  // integrand formula
                                                     -1, 1,    // x limits
                                                     -1, 1,    // y limits
                                                     -1, 1,    // z limits
                                                     2         // order of integration
    );
    Fi -= result;
}